

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_write_header(p_ply ply)

{
  p_ply_element ptVar1;
  p_ply_property ptVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (((ply == (p_ply)0x0) || ((FILE *)ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25d,"int ply_write_header(p_ply)");
  }
  if (ply->element == (p_ply_element)0x0) {
    if (ply->nelements != 0) {
      __assert_fail("ply->element || ply->nelements == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x25e,"int ply_write_header(p_ply)");
    }
  }
  else if (ply->nelements < 1) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25f,"int ply_write_header(p_ply)");
  }
  iVar4 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (iVar4 < 1) {
LAB_0011a3b8:
    uVar6 = 0;
    ply_ferror(ply,"Error writing to file");
  }
  else {
    if (0 < ply->ncomments) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        iVar4 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar8);
        if (iVar4 < 1) goto LAB_0011a3b8;
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x400;
      } while (lVar7 < ply->ncomments);
    }
    if (0 < ply->nobj_infos) {
      lVar8 = 0;
      lVar7 = 0;
      do {
        iVar4 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar8);
        if (iVar4 < 1) goto LAB_0011a3b8;
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x400;
      } while (lVar7 < ply->nobj_infos);
    }
    if (0 < ply->nelements) {
      lVar7 = 0;
      do {
        ptVar1 = ply->element + lVar7;
        if (ply->element[lVar7].property == (p_ply_property)0x0) {
          if (ptVar1->nproperties != 0) {
            __assert_fail("element->property || element->nproperties == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                          ,0x26a,"int ply_write_header(p_ply)");
          }
        }
        else if (ptVar1->nproperties < 1) {
          __assert_fail("!element->property || element->nproperties > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                        ,0x26b,"int ply_write_header(p_ply)");
        }
        iVar4 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar1,ptVar1->ninstances);
        if (iVar4 < 1) {
          bVar3 = true;
        }
        else {
          if (0 < ptVar1->nproperties) {
            lVar9 = 0;
            lVar8 = 0;
            do {
              ptVar2 = ptVar1->property;
              uVar5 = (ulong)*(uint *)((long)&ptVar2->type + lVar9);
              if (uVar5 == 0x10) {
                iVar4 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                                ply_type_list[*(uint *)((long)&ptVar2->length_type + lVar9)],
                                ply_type_list[*(uint *)((long)&ptVar2->value_type + lVar9)]);
              }
              else {
                iVar4 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar5],
                                ptVar2->name + lVar9);
              }
              bVar3 = iVar4 < 1;
              if (bVar3) goto LAB_0011a381;
              lVar8 = lVar8 + 1;
              lVar9 = lVar9 + 0x128;
            } while (lVar8 < ptVar1->nproperties);
          }
          bVar3 = false;
        }
LAB_0011a381:
        if (bVar3) {
          if (!bVar3) {
            return 0;
          }
          goto LAB_0011a3b8;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < ply->nelements);
    }
    iVar4 = fprintf((FILE *)ply->fp,"end_header\n");
    uVar6 = (uint)(0 < iVar4);
  }
  return uVar6;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0) goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0) goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0) goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type],
                            property->name) <= 0) goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}